

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptWidget(WriteIncludesBase *this,DomWidget *node)

{
  long lVar1;
  long in_FS_OFFSET;
  DomWidget *in_stack_00000038;
  TreeWalker *in_stack_00000040;
  DomCustomWidget *in_stack_00000050;
  QString *in_stack_00000058;
  WriteIncludesBase *in_stack_00000060;
  DomWidget *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DomWidget::attributeClass(in_stack_ffffffffffffffb8);
  add(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  QString::~QString((QString *)0x197a1b);
  TreeWalker::acceptWidget(in_stack_00000040,in_stack_00000038);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptWidget(DomWidget *node)
{
    add(node->attributeClass());
    TreeWalker::acceptWidget(node);
}